

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

uint64_t httplib::detail::get_header_value_uint64(Headers *headers,char *key,int def)

{
  bool bVar1;
  char *__nptr;
  _Self local_70 [3];
  allocator<char> local_51;
  key_type local_50;
  _Self local_30;
  const_iterator it;
  int def_local;
  char *key_local;
  Headers *headers_local;
  
  it._M_node._4_4_ = def;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,key,&local_51);
  local_30._M_node =
       (_Base_ptr)
       std::
       multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(headers,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  local_70[0]._M_node =
       (_Base_ptr)
       std::
       multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(headers);
  bVar1 = std::operator!=(&local_30,local_70);
  if (bVar1) {
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator->(&local_30);
    __nptr = (char *)std::__cxx11::string::data();
    headers_local = (Headers *)strtoull(__nptr,(char **)0x0,10);
  }
  else {
    headers_local = (Headers *)(long)it._M_node._4_4_;
  }
  return (uint64_t)headers_local;
}

Assistant:

inline uint64_t get_header_value_uint64(const Headers &headers, const char *key,
                                        int def = 0) {
  auto it = headers.find(key);
  if (it != headers.end()) {
    return std::strtoull(it->second.data(), nullptr, 10);
  }
  return def;
}